

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_filepath.hpp
# Opt level: O1

void __thiscall iutest::detail::iuFilePath::iuFilePath(iuFilePath *this,string *path)

{
  char *pcVar1;
  char cVar2;
  pointer pcVar3;
  char *pcVar4;
  char *__s;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  
  (this->m_path)._M_dataplus._M_p = (pointer)&(this->m_path).field_2;
  pcVar3 = (path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar3,pcVar3 + path->_M_string_length);
  pcVar7 = (this->m_path)._M_dataplus._M_p;
  pcVar4 = (char *)(this->m_path)._M_string_length;
  __s = (char *)operator_new__((ulong)(pcVar4 + 1));
  cVar2 = *pcVar7;
  pcVar5 = __s;
  while (cVar2 != '\0') {
    *pcVar5 = cVar2;
    pcVar6 = pcVar7;
    if (*pcVar7 == '/') {
      do {
        pcVar7 = pcVar6 + 1;
        pcVar1 = pcVar6 + 1;
        pcVar6 = pcVar7;
      } while (*pcVar1 == '/');
    }
    else {
      pcVar7 = pcVar7 + 1;
    }
    pcVar5 = pcVar5 + 1;
    cVar2 = *pcVar7;
  }
  *pcVar5 = '\0';
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)this,0,pcVar4,(ulong)__s);
  operator_delete__(__s);
  return;
}

Assistant:

explicit iuFilePath(const ::std::string& path) : m_path(path)
    {
        Normalize();
    }